

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.c
# Opt level: O1

int create_bonesfile(char *bonesid,char *errbuf)

{
  __uid_t _Var1;
  int iVar2;
  char *__file;
  uint *puVar3;
  char tempname [64];
  char acStack_68 [64];
  
  if (errbuf != (char *)0x0) {
    *errbuf = '\0';
  }
  sprintf(bones,"bon%s",bonesid);
  _Var1 = getuid();
  sprintf(acStack_68,"%d%s.bn",(ulong)_Var1,plname);
  __file = fqname(acStack_68,0,0);
  iVar2 = creat(__file,0x1b0);
  if (iVar2 < 0 && errbuf != (char *)0x0) {
    puVar3 = (uint *)__errno_location();
    sprintf(errbuf,"Cannot create bones id %s (errno %d).",bonesid,(ulong)*puVar3);
  }
  return iVar2;
}

Assistant:

int create_bonesfile(char *bonesid, char errbuf[])
{
	const char *file;
	char tempname[PL_NSIZ+32];
	int fd;

	if (errbuf) *errbuf = '\0';
	sprintf(bones, "bon%s", bonesid);
	sprintf(tempname, "%d%s.bn", (int)getuid(), plname);
	file = fqname(tempname, BONESPREFIX, 0);

#if defined(WIN32)
	/* Use O_TRUNC to force the file to be shortened if it already
	 * exists and is currently longer.
	 */
	fd = open(file, O_WRONLY |O_CREAT | O_TRUNC | O_BINARY, FCMASK);
#else
	fd = creat(file, FCMASK);
#endif
	if (fd < 0 && errbuf) /* failure explanation */
	    sprintf(errbuf, "Cannot create bones id %s (errno %d).",
		    bonesid, errno);

	return fd;
}